

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O0

void chacha20_quarter_round(uint32_t *state,size_t a,size_t b,size_t c,size_t d)

{
  size_t d_local;
  size_t c_local;
  size_t b_local;
  size_t a_local;
  uint32_t *state_local;
  
  state[a] = state[b] + state[a];
  state[d] = state[a] ^ state[d];
  state[d] = state[d] << 0x10 | state[d] >> 0x10;
  state[c] = state[d] + state[c];
  state[b] = state[c] ^ state[b];
  state[b] = state[b] << 0xc | state[b] >> 0x14;
  state[a] = state[b] + state[a];
  state[d] = state[a] ^ state[d];
  state[d] = state[d] << 8 | state[d] >> 0x18;
  state[c] = state[d] + state[c];
  state[b] = state[c] ^ state[b];
  state[b] = state[b] << 7 | state[b] >> 0x19;
  return;
}

Assistant:

static inline void chacha20_quarter_round( uint32_t state[16],
                                           size_t a,
                                           size_t b,
                                           size_t c,
                                           size_t d )
{
    /* a += b; d ^= a; d <<<= 16; */
    state[a] += state[b];
    state[d] ^= state[a];
    state[d] = ROTL32( state[d], 16 );

    /* c += d; b ^= c; b <<<= 12 */
    state[c] += state[d];
    state[b] ^= state[c];
    state[b] = ROTL32( state[b], 12 );

    /* a += b; d ^= a; d <<<= 8; */
    state[a] += state[b];
    state[d] ^= state[a];
    state[d] = ROTL32( state[d], 8 );

    /* c += d; b ^= c; b <<<= 7; */
    state[c] += state[d];
    state[b] ^= state[c];
    state[b] = ROTL32( state[b], 7 );
}